

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O0

brick_volume * idx2::GetBrickVolume(brick_volume *__return_storage_ptr__,brick_pool *Bp,v3i *Brick3)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  idx2_file *piVar7;
  byte *pbVar8;
  unsigned_long uVar9;
  allocator *paVar10;
  u64 uVar11;
  u64 uVar12;
  unsigned_long uVar13;
  int iVar14;
  u64 uVar15;
  uint in_R8D;
  v3i Brick3_00;
  v3i Brick3_01;
  uint local_4bc;
  uint uStack_4b8;
  uint local_49c;
  uint local_498;
  v3i BrickDimsExt3;
  int local_480;
  int iStack_47c;
  v3i BrickDims3;
  int local_460;
  int iStack_45c;
  v3i LocalBrickPos3;
  v3i E3;
  v3i D3;
  iterator AbIt;
  u64 AKey;
  u64 ABrick;
  v3i ABrick3;
  undefined8 local_390;
  v3i GroupBrick3;
  undefined1 local_370 [8];
  iterator BrickIt;
  u64 BrickKey;
  i8 Resolution;
  u64 BrickIndex;
  i8 Level;
  v3i *Brick3_local;
  brick_pool *Bp_local;
  int local_2c8;
  int iStack_2c4;
  int local_240;
  int I;
  undefined8 local_230;
  v3i Result;
  undefined8 local_1f8;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  uint local_1d0;
  undefined8 *local_1c8;
  v3i *local_1c0;
  undefined8 local_1b8;
  uint local_1ac;
  int local_1a8;
  int local_1a4;
  undefined8 *local_1a0;
  int local_108;
  int iStack_104;
  int local_c8;
  int iStack_c4;
  v3i *local_80;
  ulong uVar16;
  
  Brick3_00.field_0.field_0.Y = 0;
  Brick3_00.field_0.field_0.X = (Brick3->field_0).field_0.Z;
  Brick3_00.field_0.field_0.Z = in_R8D;
  uVar16 = (ulong)in_R8D;
  uVar15 = GetLinearBrick((idx2 *)Bp->Idx2,(idx2_file *)0x0,(int)*(undefined8 *)&Brick3->field_0,
                          Brick3_00);
  bVar1 = (Bp->ResolutionLevels).Buffer.Data[uVar15];
  if (bVar1 == 0) {
    BrickIt.Idx = uVar15 * 0x10;
    Lookup<unsigned_long,idx2::brick_volume>
              ((iterator *)local_370,(idx2 *)Bp,
               (hash_table<unsigned_long,_idx2::brick_volume> *)&BrickIt.Idx,(unsigned_long *)0x0);
    piVar7 = Bp->Idx2;
    local_80 = &piVar7->BrickDimsExt3;
    uVar2 = (local_80->field_0).field_0.X;
    uVar3 = (piVar7->BrickDimsExt3).field_0.field_0.Y;
    uVar4 = (piVar7->BrickDimsExt3).field_0.field_0.Z;
    BrickIt.Key[5] = 0;
    BrickIt.Key[6] =
         (long)(int)(uVar2 & 0x1fffff) + (long)(int)(uVar3 & 0x1fffff) * 0x200000 +
         ((long)(int)(uVar4 & 0x1fffff) << 0x2a);
    memcpy(__return_storage_ptr__,BrickIt.Key,0x40);
  }
  else {
    piVar7 = Bp->Idx2;
    unique0x00004880 = &local_230;
    Result.field_0.field_0.Y = 1;
    local_230._0_4_ = 1;
    local_230._4_4_ = 1;
    Result.field_0.field_0.X = 1;
    for (local_240 = 0; local_240 < (char)bVar1; local_240 = local_240 + 1) {
      uVar2 = (piVar7->GroupBrick3).field_0.field_0.X;
      uVar16 = (ulong)uVar2;
      local_1e4 = (int)local_230 * uVar2;
      local_1e8 = local_230._4_4_ * (piVar7->GroupBrick3).field_0.field_0.Y;
      Result.field_0.field_0.X = Result.field_0.field_0.X * (piVar7->GroupBrick3).field_0.field_0.Z;
      local_1e0 = &local_1f8;
      local_1f8._0_4_ = local_1e4;
      local_1f8._4_4_ = local_1e8;
      local_230 = local_1f8;
      local_1ec = Result.field_0.field_0.X;
    }
    GroupBrick3.field_0.field_0.X = Result.field_0.field_0.X;
    local_390 = local_230;
    local_1c8 = &local_390;
    local_1a4 = (Brick3->field_0).field_0.X / (int)local_230;
    local_1a8 = (Brick3->field_0).field_0.Y / local_230._4_4_;
    local_1d0 = (Brick3->field_0).field_0.Z / Result.field_0.field_0.X;
    local_1a0 = &local_1b8;
    local_1b8._0_4_ = local_1a4;
    local_1b8._4_4_ = local_1a8;
    local_1d8 = local_1b8;
    Brick3_01.field_0.field_0.Y = 0;
    Brick3_01.field_0.field_0.X = local_1d0;
    Brick3_01.field_0._8_4_ = (undefined4)uVar16;
    local_1c0 = Brick3;
    local_1ac = local_1d0;
    uVar15 = GetLinearBrick((idx2 *)Bp->Idx2,(idx2_file *)(ulong)(uint)(int)(char)bVar1,
                            (int)local_1b8,Brick3_01);
    AbIt.Idx = (i64)((unsigned_long *)(long)(char)bVar1 + uVar15 * 2);
    Lookup<unsigned_long,idx2::brick_volume>
              ((iterator *)((long)&D3.field_0.field_4.YZ.field_0 + 4),(idx2 *)Bp,
               (hash_table<unsigned_long,_idx2::brick_volume> *)&AbIt.Idx,
               (unsigned_long *)(long)(char)bVar1);
    iVar5 = (Brick3->field_0).field_0.Z;
    local_108 = (Brick3->field_0).field_0.X % (int)local_390;
    iStack_104 = (Brick3->field_0).field_0.Y % local_390._4_4_;
    piVar7 = Bp->Idx2;
    iVar14 = 1 << (bVar1 & 0x1f);
    iVar6 = (piVar7->BrickDims3).field_0.field_0.Z;
    local_c8 = (piVar7->BrickDims3).field_0.field_0.X / iVar14;
    iStack_c4 = (piVar7->BrickDims3).field_0.field_0.Y / iVar14;
    pbVar8 = (byte *)*AbIt.Key;
    uVar9 = AbIt.Key[1];
    paVar10 = (allocator *)AbIt.Key[2];
    uVar15 = AbIt.Key[3];
    uVar11 = AbIt.Key[5];
    uVar12 = AbIt.Key[6];
    uVar13 = AbIt.Key[7];
    *(unsigned_long *)&(__return_storage_ptr__->Vol).Type = AbIt.Key[4];
    (__return_storage_ptr__->ExtentLocal).From = uVar11;
    (__return_storage_ptr__->ExtentLocal).Dims = uVar12;
    __return_storage_ptr__->NChildrenDecoded = (char)uVar13;
    __return_storage_ptr__->NChildrenMax = (char)(uVar13 >> 8);
    __return_storage_ptr__->Significant = (bool)(char)(uVar13 >> 0x10);
    __return_storage_ptr__->DoneDecoding = (bool)(char)(uVar13 >> 0x18);
    *(int *)&__return_storage_ptr__->field_0x3c = (int)(uVar13 >> 0x20);
    (__return_storage_ptr__->Vol).Buffer.Data = pbVar8;
    (__return_storage_ptr__->Vol).Buffer.Bytes = uVar9;
    (__return_storage_ptr__->Vol).Buffer.Alloc = paVar10;
    (__return_storage_ptr__->Vol).Dims = uVar15;
    local_460 = (int)_local_108;
    iStack_45c = (int)((ulong)_local_108 >> 0x20);
    local_480 = (int)_local_c8;
    iStack_47c = (int)((ulong)_local_c8 >> 0x20);
    local_2c8 = local_460 * local_480;
    iStack_2c4 = iStack_45c * iStack_47c;
    local_4bc = (uint)_local_2c8;
    uStack_4b8 = (uint)((ulong)_local_2c8 >> 0x20);
    (__return_storage_ptr__->ExtentLocal).From =
         (long)(int)(local_4bc & 0x1fffff) + (long)(int)(uStack_4b8 & 0x1fffff) * 0x200000 +
         ((long)(int)((iVar5 % GroupBrick3.field_0.field_0.X) * (iVar6 / iVar14) & 0x1fffff) << 0x2a
         );
    (__return_storage_ptr__->ExtentLocal).Dims =
         (long)(int)(local_49c & 0x1fffff) + (long)(int)(local_498 & 0x1fffff) * 0x200000 +
         ((long)(int)(BrickDimsExt3.field_0.field_0.X & 0x1fffff) << 0x2a);
    __return_storage_ptr__->Significant = false;
  }
  return __return_storage_ptr__;
}

Assistant:

brick_volume
GetBrickVolume(brick_pool* Bp, const v3i& Brick3)
{
  const i8 Level = 0;
  u64 BrickIndex = GetLinearBrick(*Bp->Idx2, Level, Brick3);
  i8 Resolution = Bp->ResolutionLevels[BrickIndex];

  if (Resolution == 0)
  {
    u64 BrickKey = GetBrickKey(Level, BrickIndex);
    auto BrickIt = Lookup(Bp->BrickTable, BrickKey);
    idx2_Assert(BrickIt);
    BrickIt.Val->ExtentLocal = extent(Bp->Idx2->BrickDimsExt3);
    return *BrickIt.Val;
  }

  /* if resolution > 0, we need to find the ancestor */
  v3i GroupBrick3 = Pow(Bp->Idx2->GroupBrick3, Resolution);
  v3i ABrick3 = Brick3 / GroupBrick3;
  u64 ABrick = GetLinearBrick(*Bp->Idx2, Resolution, ABrick3);
  u64 AKey = GetBrickKey(Resolution, ABrick);
  auto AbIt = Lookup(Bp->BrickTable, AKey);
  idx2_Assert(AbIt);
  v3i D3 = Dims(AbIt.Val->Vol);
  v3i E3 = Dims(AbIt.Val->ExtentLocal);

  v3i LocalBrickPos3 = Brick3 % GroupBrick3;
  v3i BrickDims3 = (Bp->Idx2->BrickDims3 / (1 << Resolution));
  v3i BrickDimsExt3 = idx2_ExtDims(BrickDims3);
  brick_volume BrickVol = *AbIt.Val;
  BrickVol.ExtentLocal = extent(LocalBrickPos3 * BrickDims3, BrickDimsExt3);
  BrickVol.Significant = false;
  // BrickVol.NChildrenMax or NChildrenDecoded?

  return BrickVol;
}